

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::processDependencyInfoDiscoveredDependencies::DepsActions::error
          (DepsActions *this,char *message,uint64_t position)

{
  ShellCommand *pSVar1;
  uint64_t uVar2;
  BuildSystemDelegate *pBVar3;
  undefined8 uVar4;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [56];
  uint64_t position_local;
  char *message_local;
  DepsActions *this_local;
  undefined1 *local_10;
  
  local_60._48_8_ = position;
  position_local = (uint64_t)message;
  message_local = (char *)this;
  pBVar3 = BuildSystem::getDelegate(this->system);
  pSVar1 = this->command;
  llvm::StringRef::str_abi_cxx11_(&local_c0,&this->depsPath);
  std::operator+(&local_a0,"error reading dependency file \'",&local_c0);
  std::operator+(&local_80,&local_a0,"\': ");
  uVar2 = position_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,(char *)uVar2,&local_e1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,&local_e0);
  local_10 = local_60 + 0x20;
  this_local = (DepsActions *)local_60;
  local_60._32_8_ = std::__cxx11::string::data();
  uVar4 = std::__cxx11::string::length();
  (*pBVar3->_vptr_BuildSystemDelegate[0xb])(pBVar3,pSVar1,local_60._32_8_,uVar4);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  this->numErrors = this->numErrors + 1;
  return;
}

Assistant:

virtual void error(const char* message, uint64_t position) override {
      system.getDelegate().commandHadError(
          command, ("error reading dependency file '" + depsPath.str() +
                    "': " + std::string(message)));
      ++numErrors;
    }